

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O2

void __thiscall IRCCommand::~IRCCommand(IRCCommand *this)

{
  const_iterator __position;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00119bc0;
  __position._M_current =
       g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_00110674:
      std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>::
      ~vector(&this->m_channels);
      std::_Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>::
      ~_Vector_base(&(this->m_types).
                     super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
                   );
      Jupiter::Command::~Command(&this->super_Command);
      return;
    }
    if (*__position._M_current == this) {
      ServerManager::removeCommand(serverManager,this);
      std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::erase
                (&g_IRCMasterCommandList,__position);
      goto LAB_00110674;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

IRCCommand::~IRCCommand() {
	// Remove any weak references to this
	for (auto itr = IRCMasterCommandList.begin(); itr != IRCMasterCommandList.end(); ++itr) {
		if (*itr == this) {
			serverManager->removeCommand(this);
			IRCMasterCommandList.erase(itr);
			break;
		}
	}
}